

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meta_transaction.cpp
# Opt level: O2

Transaction * __thiscall
duckdb::MetaTransaction::GetTransaction(MetaTransaction *this,AttachedDatabase *db)

{
  int iVar1;
  iterator iVar2;
  TransactionManager *pTVar3;
  undefined4 extraout_var;
  key_type local_38;
  Transaction *local_30;
  Transaction *pTVar4;
  
  ::std::mutex::lock(&this->lock);
  local_38._M_data = db;
  iVar2 = ::std::
          _Hashtable<std::reference_wrapper<duckdb::AttachedDatabase>,_std::pair<const_std::reference_wrapper<duckdb::AttachedDatabase>,_std::reference_wrapper<duckdb::Transaction>_>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::AttachedDatabase>,_std::reference_wrapper<duckdb::Transaction>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::AttachedDatabase>,_duckdb::ReferenceHashFunction<duckdb::AttachedDatabase>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->transactions)._M_h,&local_38);
  if (iVar2.
      super__Node_iterator_base<std::pair<const_std::reference_wrapper<duckdb::AttachedDatabase>,_std::reference_wrapper<duckdb::Transaction>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    pTVar3 = AttachedDatabase::GetTransactionManager(db);
    iVar1 = (*pTVar3->_vptr_TransactionManager[2])(pTVar3,this->context);
    pTVar4 = (Transaction *)CONCAT44(extraout_var,iVar1);
    LOCK();
    (pTVar4->active_query).super___atomic_base<unsigned_long>._M_i =
         (this->active_query).super___atomic_base<unsigned_long>._M_i;
    UNLOCK();
    local_38._M_data = db;
    ::std::
    vector<std::reference_wrapper<duckdb::AttachedDatabase>,std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>>>
    ::emplace_back<std::reference_wrapper<duckdb::AttachedDatabase>>
              ((vector<std::reference_wrapper<duckdb::AttachedDatabase>,std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>>>
                *)&this->all_transactions,&local_38);
    local_38._M_data = db;
    local_30 = pTVar4;
    ::std::
    _Hashtable<std::reference_wrapper<duckdb::AttachedDatabase>,std::pair<std::reference_wrapper<duckdb::AttachedDatabase>const,std::reference_wrapper<duckdb::Transaction>>,std::allocator<std::pair<std::reference_wrapper<duckdb::AttachedDatabase>const,std::reference_wrapper<duckdb::Transaction>>>,std::__detail::_Select1st,duckdb::ReferenceEquality<duckdb::AttachedDatabase>,duckdb::ReferenceHashFunction<duckdb::AttachedDatabase>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<std::pair<duckdb::AttachedDatabase&,duckdb::Transaction&>>
              ((_Hashtable<std::reference_wrapper<duckdb::AttachedDatabase>,std::pair<std::reference_wrapper<duckdb::AttachedDatabase>const,std::reference_wrapper<duckdb::Transaction>>,std::allocator<std::pair<std::reference_wrapper<duckdb::AttachedDatabase>const,std::reference_wrapper<duckdb::Transaction>>>,std::__detail::_Select1st,duckdb::ReferenceEquality<duckdb::AttachedDatabase>,duckdb::ReferenceHashFunction<duckdb::AttachedDatabase>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&this->transactions);
  }
  else {
    pTVar4 = *(Transaction **)
              ((long)iVar2.
                     super__Node_iterator_base<std::pair<const_std::reference_wrapper<duckdb::AttachedDatabase>,_std::reference_wrapper<duckdb::Transaction>_>,_true>
                     ._M_cur + 0x10);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->lock);
  return pTVar4;
}

Assistant:

Transaction &MetaTransaction::GetTransaction(AttachedDatabase &db) {
	lock_guard<mutex> guard(lock);
	auto entry = transactions.find(db);
	if (entry == transactions.end()) {
		auto &new_transaction = db.GetTransactionManager().StartTransaction(context);
		new_transaction.active_query = active_query.load();
#ifdef DEBUG
		VerifyAllTransactionsUnique(db, all_transactions);
#endif
		all_transactions.push_back(db);
		transactions.insert(make_pair(reference<AttachedDatabase>(db), reference<Transaction>(new_transaction)));

		return new_transaction;
	} else {
		D_ASSERT(entry->second.get().active_query == active_query);
		return entry->second;
	}
}